

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

string * __thiscall
cmNinjaTargetGenerator::GetTargetDependInfoPath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *lang)

{
  pointer pcVar1;
  string *psVar2;
  long *plVar3;
  long *plVar4;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  psVar2 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar2->_M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[0xc])
            (&local_60,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60);
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  std::operator+(&local_40,"/",lang);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_50 = *plVar4;
    lStack_48 = plVar3[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar4;
    local_60 = (long *)*plVar3;
  }
  local_58 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60);
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetTargetDependInfoPath(
  std::string const& lang) const
{
  std::string path = this->Makefile->GetCurrentBinaryDirectory();
  path += "/";
  path += this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
  path += "/" + lang + "DependInfo.json";
  return path;
}